

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::LocalsWalker::LocalsWalker(LocalsWalker *this,DiagStackFrame *_frame,DWORD _frameWalkerFlags)

{
  DiagStackFrame *pDVar1;
  code *pcVar2;
  FrameDisplay *pFVar3;
  bool bVar4;
  uint16 uVar5;
  int iVar6;
  RegSlot RVar7;
  undefined4 extraout_var;
  Utf8SourceInfo *this_00;
  undefined4 extraout_var_00;
  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar8;
  undefined4 extraout_var_01;
  ScopeObjectChain *pSVar9;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar10;
  DiagScopeVariablesWalker *pDVar11;
  VariableWalkerBase *pVVar12;
  undefined4 extraout_var_02;
  undefined4 *puVar13;
  void *pvVar14;
  RecyclableObject *pRVar15;
  undefined4 extraout_var_03;
  RecyclableObject *pRVar16;
  PropertyIdOnRegSlotsContainer *pPVar17;
  RegSlotVariablesWalker *this_01;
  undefined4 extraout_var_04;
  JavascriptLibrary *pJVar18;
  RecyclableObjectWalker *this_02;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  byte local_3a1;
  uint local_37c;
  TrackAllocData local_360;
  VariableWalkerBase *local_338;
  code *local_330;
  undefined8 local_328;
  TrackAllocData local_320;
  DiagScopeVariablesWalker *local_2f8;
  code *local_2f0;
  undefined8 local_2e8;
  TrackAllocData local_2e0;
  RecyclableObjectWalker *local_2b8;
  RecyclableObjectWalker *withScopeWalker;
  undefined8 local_2a8;
  TrackAllocData local_2a0;
  VariableWalkerBase *local_278;
  code *local_270;
  undefined8 local_268;
  TrackAllocData local_260;
  VariableWalkerBase *local_238;
  ScopeType local_22c;
  RecyclableObject *pRStack_228;
  ScopeType scopeType;
  Var currentScopeObject;
  RecyclableObject *pRStack_218;
  uint i;
  Var nullVar;
  undefined8 local_208;
  TrackAllocData local_200;
  RegSlotVariablesWalker *local_1d8;
  code *local_1d0;
  undefined8 local_1c8;
  TrackAllocData local_1c0;
  VariableWalkerBase *local_198;
  code *local_190;
  undefined8 local_188;
  TrackAllocData local_180;
  VariableWalkerBase *local_158;
  code *local_150;
  undefined8 local_148;
  TrackAllocData local_140;
  code *local_118;
  undefined8 local_110;
  TrackAllocData local_108;
  VariableWalkerBase *local_e0;
  VariableWalkerBase *pVarWalker;
  DebuggerScope *pDStack_d0;
  DWORD localsType;
  DebuggerScope *formalScope;
  undefined8 local_c0;
  TrackAllocData local_b8;
  VariableWalkerBase *local_90;
  byte local_82;
  byte local_81;
  bool dontAddGlobalsDirectly;
  code *pcStack_80;
  bool shouldAddGlobalItemsDirectly;
  undefined8 local_78;
  TrackAllocData local_70;
  DiagScopeVariablesWalker *local_48;
  uint local_40;
  uint local_3c;
  uint nextStartIndex;
  uint scopeCount;
  FrameDisplay *pDisplay;
  ArenaAllocator *arena;
  FunctionBody *pFBody;
  DiagStackFrame *pDStack_18;
  DWORD _frameWalkerFlags_local;
  DiagStackFrame *_frame_local;
  LocalsWalker *this_local;
  
  pFBody._4_4_ = _frameWalkerFlags;
  pDStack_18 = _frame;
  _frame_local = (DiagStackFrame *)this;
  IDiagObjectModelWalkerBase::IDiagObjectModelWalkerBase(&this->super_IDiagObjectModelWalkerBase);
  (this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
       (_func_int **)&PTR_Get_01dea788;
  this->pFrame = pDStack_18;
  this->pVarWalkers =
       (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  this->totalLocalsCount = 0;
  this->frameWalkerFlags = pFBody._4_4_;
  this->hasUserNotDefinedArguments = false;
  iVar6 = (*this->pFrame->_vptr_DiagStackFrame[2])();
  arena = (ArenaAllocator *)
          JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar6));
  if ((FunctionBody *)arena != (FunctionBody *)0x0) {
    this_00 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)arena);
    bVar4 = Utf8SourceInfo::GetIsLibraryCode(this_00);
    if (!bVar4) {
      iVar6 = (*this->pFrame->_vptr_DiagStackFrame[0xe])();
      pDisplay = (FrameDisplay *)CONCAT44(extraout_var_00,iVar6);
      pLVar8 = JsUtil::
               List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::New((ArenaAllocator *)pDisplay,4);
      this->pVarWalkers = pLVar8;
      iVar6 = (*this->pFrame->_vptr_DiagStackFrame[0xf])();
      _nextStartIndex = (FrameDisplay *)CONCAT44(extraout_var_01,iVar6);
      if (_nextStartIndex == (FrameDisplay *)0x0) {
        local_37c = 0;
      }
      else {
        uVar5 = FrameDisplay::GetLength(_nextStartIndex);
        local_37c = (uint)uVar5;
      }
      local_3c = local_37c;
      local_40 = 0;
      pSVar9 = FunctionBody::GetScopeObjectChain((FunctionBody *)arena);
      pFVar3 = pDisplay;
      if (pSVar9 != (ScopeObjectChain *)0x0) {
        pLVar8 = this->pVarWalkers;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_70,(type_info *)&DiagScopeVariablesWalker::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                   ,0x43b);
        pAVar10 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pFVar3,&local_70);
        pcStack_80 = Memory::ArenaAllocator::Alloc;
        local_78 = 0;
        pDVar11 = (DiagScopeVariablesWalker *)
                  new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar10,0x3f67b0);
        DiagScopeVariablesWalker::DiagScopeVariablesWalker
                  (pDVar11,this->pFrame,(Var)0x0,(this->frameWalkerFlags & 2) != 0);
        local_48 = pDVar11;
        JsUtil::
        List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(pLVar8,(VariableWalkerBase **)&local_48);
      }
      bVar4 = ParseableFunctionInfo::GetIsGlobalFunc((ParseableFunctionInfo *)arena);
      local_3a1 = 0;
      if (bVar4) {
        bVar4 = ParseableFunctionInfo::IsEval((ParseableFunctionInfo *)arena);
        local_3a1 = bVar4 ^ 0xff;
      }
      pFVar3 = pDisplay;
      local_81 = local_3a1 & 1;
      local_82 = (this->frameWalkerFlags & 0x10) == 0x10;
      if ((local_81 != 0) && (!(bool)local_82)) {
        pLVar8 = this->pVarWalkers;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_b8,(type_info *)&RootObjectVariablesWalker::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                   ,0x444);
        pAVar10 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pFVar3,&local_b8);
        formalScope = (DebuggerScope *)Memory::ArenaAllocator::Alloc;
        local_c0 = 0;
        pVVar12 = (VariableWalkerBase *)
                  new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar10,0x3f67b0);
        pDVar1 = this->pFrame;
        iVar6 = (*this->pFrame->_vptr_DiagStackFrame[0x11])();
        RootObjectVariablesWalker::RootObjectVariablesWalker
                  ((RootObjectVariablesWalker *)pVVar12,pDVar1,(Var)CONCAT44(extraout_var_02,iVar6),
                   UIGroupType_None);
        local_90 = pVVar12;
        JsUtil::
        List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(pLVar8,&local_90);
      }
      pDStack_d0 = GetScopeWhenHaltAtFormals(this->pFrame);
      pVarWalker._4_4_ = GetCurrentFramesLocalsType(this->pFrame);
      bVar4 = VariableWalkerBase::IsInParamScope(pDStack_d0,this->pFrame);
      if ((!bVar4) ||
         (bVar4 = FunctionBody::IsParamAndBodyScopeMerged((FunctionBody *)arena), bVar4)) {
        local_e0 = (VariableWalkerBase *)0x0;
        if ((pVarWalker._4_4_ & 4) == 0) {
          if ((pVarWalker._4_4_ & 2) == 0) {
            if (((local_3c != 0) &&
                (RVar7 = FunctionBody::GetFrameDisplayRegister((FunctionBody *)arena), RVar7 != 0))
               && (bVar4 = FunctionBody::IsParamAndBodyScopeMerged((FunctionBody *)arena), bVar4)) {
              pRVar15 = (RecyclableObject *)FrameDisplay::GetItem(_nextStartIndex,0);
              iVar6 = (*this->pFrame->_vptr_DiagStackFrame[10])();
              pJVar18 = ScriptContext::GetLibrary((ScriptContext *)CONCAT44(extraout_var_03,iVar6));
              pRVar16 = JavascriptLibraryBase::GetNull(&pJVar18->super_JavascriptLibraryBase);
              if (pRVar15 != pRVar16) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar13 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                            ,0x45e,
                                            "((Var)pDisplay->GetItem(0) == pFrame->GetScriptContext()->GetLibrary()->GetNull())"
                                            ,
                                            "(Var)pDisplay->GetItem(0) == pFrame->GetScriptContext()->GetLibrary()->GetNull()"
                                           );
                if (!bVar4) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar13 = 0;
              }
              local_40 = local_40 + 1;
            }
          }
          else {
            if (local_3c == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                          ,0x458,"(scopeCount > 0)","scopeCount > 0");
              if (!bVar4) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 0;
            }
            pFVar3 = pDisplay;
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_140,(type_info *)&SlotArrayVariablesWalker::typeinfo,0,
                       0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                       ,0x459);
            pAVar10 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                      *)pFVar3,&local_140);
            local_150 = Memory::ArenaAllocator::Alloc;
            local_148 = 0;
            pVVar12 = (VariableWalkerBase *)
                      new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar10,0x3f67b0);
            pDVar1 = this->pFrame;
            pvVar14 = FrameDisplay::GetItem(_nextStartIndex,local_40);
            SlotArrayVariablesWalker::SlotArrayVariablesWalker
                      ((SlotArrayVariablesWalker *)pVVar12,pDVar1,pvVar14,UIGroupType_None,
                       (this->frameWalkerFlags & 4) != 0,(this->frameWalkerFlags & 8) != 0);
            local_40 = local_40 + 1;
            local_e0 = pVVar12;
          }
        }
        else {
          if (local_3c == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0x452,"(scopeCount > 0)","scopeCount > 0");
            if (!bVar4) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 0;
          }
          pFVar3 = pDisplay;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_108,(type_info *)&ObjectVariablesWalker::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                     ,0x453);
          pAVar10 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                    TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    *)pFVar3,&local_108);
          local_118 = Memory::ArenaAllocator::Alloc;
          local_110 = 0;
          pVVar12 = (VariableWalkerBase *)
                    new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar10,0x3f67b0);
          pDVar1 = this->pFrame;
          pvVar14 = FrameDisplay::GetItem(_nextStartIndex,local_40);
          ObjectVariablesWalker::ObjectVariablesWalker
                    ((ObjectVariablesWalker *)pVVar12,pDVar1,pvVar14,UIGroupType_None,
                     (this->frameWalkerFlags & 4) != 0,(this->frameWalkerFlags & 8) != 0);
          local_40 = local_40 + 1;
          local_e0 = pVVar12;
        }
        if (local_e0 != (VariableWalkerBase *)0x0) {
          JsUtil::
          List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(this->pVarWalkers,&local_e0);
        }
      }
      if ((pDStack_d0 != (DebuggerScope *)0x0) &&
         (bVar4 = FunctionBody::IsParamAndBodyScopeMerged((FunctionBody *)arena), !bVar4)) {
        pPVar17 = FunctionBody::GetPropertyIdOnRegSlotsContainer((FunctionBody *)arena);
        if ((pPVar17 != (PropertyIdOnRegSlotsContainer *)0x0) &&
           (pPVar17 = FunctionBody::GetPropertyIdOnRegSlotsContainer((FunctionBody *)arena),
           pPVar17->formalsUpperBound != 0xffffffff)) {
          pVarWalker._4_4_ = pVarWalker._4_4_ | 1;
        }
        if (local_3c == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x470,"(scopeCount > 0)","scopeCount > 0");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        pFVar3 = pDisplay;
        if (pDStack_d0->scopeType == DiagParamScopeInObject) {
          pLVar8 = this->pVarWalkers;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_180,(type_info *)&ObjectVariablesWalker::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                     ,0x474);
          pAVar10 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                    TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    *)pFVar3,&local_180);
          local_190 = Memory::ArenaAllocator::Alloc;
          local_188 = 0;
          pVVar12 = (VariableWalkerBase *)
                    new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar10,0x3f67b0);
          pDVar1 = this->pFrame;
          pvVar14 = FrameDisplay::GetItem(_nextStartIndex,local_40);
          ObjectVariablesWalker::ObjectVariablesWalker
                    ((ObjectVariablesWalker *)pVVar12,pDVar1,pvVar14,UIGroupType_Param,
                     (this->frameWalkerFlags & 4) != 0,(this->frameWalkerFlags & 8) != 0);
          local_158 = pVVar12;
          JsUtil::
          List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(pLVar8,&local_158);
        }
        else {
          pLVar8 = this->pVarWalkers;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_1c0,(type_info *)&SlotArrayVariablesWalker::typeinfo,0,
                     0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                     ,0x478);
          pAVar10 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                    TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    *)pFVar3,&local_1c0);
          local_1d0 = Memory::ArenaAllocator::Alloc;
          local_1c8 = 0;
          pVVar12 = (VariableWalkerBase *)
                    new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar10,0x3f67b0);
          pDVar1 = this->pFrame;
          pvVar14 = FrameDisplay::GetItem(_nextStartIndex,local_40);
          SlotArrayVariablesWalker::SlotArrayVariablesWalker
                    ((SlotArrayVariablesWalker *)pVVar12,pDVar1,pvVar14,UIGroupType_Param,
                     (this->frameWalkerFlags & 4) != 0,(this->frameWalkerFlags & 8) != 0);
          local_198 = pVVar12;
          JsUtil::
          List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(pLVar8,&local_198);
        }
        local_40 = local_40 + 1;
      }
      pFVar3 = pDisplay;
      if ((pVarWalker._4_4_ & 1) != 0) {
        pLVar8 = this->pVarWalkers;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_200,(type_info *)&RegSlotVariablesWalker::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                   ,0x47f);
        pAVar10 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pFVar3,&local_200);
        nullVar = Memory::ArenaAllocator::Alloc;
        local_208 = 0;
        this_01 = (RegSlotVariablesWalker *)
                  new<Memory::ArenaAllocator>(0x30,(ArenaAllocator *)pAVar10,0x3f67b0);
        RegSlotVariablesWalker::RegSlotVariablesWalker
                  (this_01,this->pFrame,(DebuggerScope *)0x0,UIGroupType_None,
                   (this->frameWalkerFlags & 8) != 0);
        local_1d8 = this_01;
        JsUtil::
        List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(pLVar8,(VariableWalkerBase **)&local_1d8);
      }
      iVar6 = (*this->pFrame->_vptr_DiagStackFrame[10])();
      pJVar18 = ScriptContext::GetLibrary((ScriptContext *)CONCAT44(extraout_var_04,iVar6));
      pRStack_218 = JavascriptLibraryBase::GetNull(&pJVar18->super_JavascriptLibraryBase);
      for (currentScopeObject._4_4_ = local_40; pFVar3 = pDisplay,
          currentScopeObject._4_4_ < local_3c;
          currentScopeObject._4_4_ = currentScopeObject._4_4_ + 1) {
        pRStack_228 = (RecyclableObject *)
                      FrameDisplay::GetItem(_nextStartIndex,currentScopeObject._4_4_);
        if ((pRStack_228 != (RecyclableObject *)0x0) && (pRStack_228 != pRStack_218)) {
          local_22c = FrameDisplay::GetScopeType(pRStack_228);
          pFVar3 = pDisplay;
          if (local_22c == ScopeType_ActivationObject) {
            pLVar8 = this->pVarWalkers;
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_260,(type_info *)&ObjectVariablesWalker::typeinfo,0,0xffffffffffffffff
                       ,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                       ,0x48c);
            pAVar10 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                      *)pFVar3,&local_260);
            local_270 = Memory::ArenaAllocator::Alloc;
            local_268 = 0;
            pVVar12 = (VariableWalkerBase *)
                      new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar10,0x3f67b0);
            ObjectVariablesWalker::ObjectVariablesWalker
                      ((ObjectVariablesWalker *)pVVar12,this->pFrame,pRStack_228,UIGroupType_Scope,
                       (this->frameWalkerFlags & 4) != 0,(this->frameWalkerFlags & 8) != 0);
            local_238 = pVVar12;
            JsUtil::
            List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Add(pLVar8,&local_238);
          }
          else if (local_22c == ScopeType_SlotArray) {
            pLVar8 = this->pVarWalkers;
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_2a0,(type_info *)&SlotArrayVariablesWalker::typeinfo,0,
                       0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                       ,0x48f);
            pAVar10 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                      *)pFVar3,&local_2a0);
            withScopeWalker = (RecyclableObjectWalker *)Memory::ArenaAllocator::Alloc;
            local_2a8 = 0;
            pVVar12 = (VariableWalkerBase *)
                      new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar10,0x3f67b0);
            SlotArrayVariablesWalker::SlotArrayVariablesWalker
                      ((SlotArrayVariablesWalker *)pVVar12,this->pFrame,pRStack_228,
                       UIGroupType_Scope,(this->frameWalkerFlags & 4) != 0,
                       (this->frameWalkerFlags & 8) != 0);
            local_278 = pVVar12;
            JsUtil::
            List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Add(pLVar8,&local_278);
          }
          else if (local_22c == ScopeType_WithScope) {
            if ((this->frameWalkerFlags & 2) == 2) {
              Memory::TrackAllocData::CreateTrackAllocData
                        (&local_2e0,(type_info *)&RecyclableObjectWalker::typeinfo,0,
                         0xffffffffffffffff,
                         "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                         ,0x494);
              pAVar10 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                        TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                        *)pFVar3,&local_2e0);
              local_2f0 = Memory::ArenaAllocator::Alloc;
              local_2e8 = 0;
              this_02 = (RecyclableObjectWalker *)
                        new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar10,0x3f67b0);
              iVar6 = (*this->pFrame->_vptr_DiagStackFrame[10])();
              RecyclableObjectWalker::RecyclableObjectWalker
                        (this_02,(ScriptContext *)CONCAT44(extraout_var_05,iVar6),pRStack_228);
              pFVar3 = pDisplay;
              pLVar8 = this->pVarWalkers;
              local_2b8 = this_02;
              Memory::TrackAllocData::CreateTrackAllocData
                        (&local_320,(type_info *)&DiagScopeVariablesWalker::typeinfo,0,
                         0xffffffffffffffff,
                         "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                         ,0x495);
              pAVar10 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                        TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                        *)pFVar3,&local_320);
              local_330 = Memory::ArenaAllocator::Alloc;
              local_328 = 0;
              pDVar11 = (DiagScopeVariablesWalker *)
                        new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar10,0x3f67b0);
              DiagScopeVariablesWalker::DiagScopeVariablesWalker
                        (pDVar11,this->pFrame,pRStack_228,
                         &local_2b8->super_IDiagObjectModelWalkerBase);
              local_2f8 = pDVar11;
              JsUtil::
              List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Add(pLVar8,(VariableWalkerBase **)&local_2f8);
            }
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0x499,"(false)","false");
            if (!bVar4) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 0;
          }
        }
      }
      if (((local_81 & 1) == 0) && ((local_82 & 1) == 0)) {
        pLVar8 = this->pVarWalkers;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_360,(type_info *)&RootObjectVariablesWalker::typeinfo,0,0xffffffffffffffff
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                   ,0x4a1);
        pAVar10 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pFVar3,&local_360);
        pVVar12 = (VariableWalkerBase *)
                  new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar10,0x3f67b0);
        pDVar1 = this->pFrame;
        iVar6 = (*this->pFrame->_vptr_DiagStackFrame[0x11])();
        RootObjectVariablesWalker::RootObjectVariablesWalker
                  ((RootObjectVariablesWalker *)pVVar12,pDVar1,(Var)CONCAT44(extraout_var_06,iVar6),
                   UIGroupType_Globals);
        local_338 = pVVar12;
        JsUtil::
        List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(pLVar8,&local_338);
      }
    }
  }
  return;
}

Assistant:

LocalsWalker::LocalsWalker(DiagStackFrame* _frame, DWORD _frameWalkerFlags)
        :  pFrame(_frame), frameWalkerFlags(_frameWalkerFlags), pVarWalkers(nullptr), totalLocalsCount(0), hasUserNotDefinedArguments(false)
    {
        Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();
        if (pFBody && !pFBody->GetUtf8SourceInfo()->GetIsLibraryCode())
        {
            // Allocate the container of all walkers.
            ArenaAllocator *arena = pFrame->GetArena();
            pVarWalkers = JsUtil::List<VariableWalkerBase *, ArenaAllocator>::New(arena);

            // Top most function will have one of these regslot, slotarray or activation object.

            FrameDisplay * pDisplay = pFrame->GetFrameDisplay();
            uint scopeCount = (uint)(pDisplay ? pDisplay->GetLength() : 0);

            uint nextStartIndex = 0;

            // Add the catch/with/block expression scope objects.
            if (pFBody->GetScopeObjectChain())
            {
                pVarWalkers->Add(Anew(arena, DiagScopeVariablesWalker, pFrame, nullptr, !!(frameWalkerFlags & FrameWalkerFlags::FW_EnumWithScopeAlso)));
            }

            // In the eval function, we will not show global items directly, instead they should go as a group node.
            bool shouldAddGlobalItemsDirectly = pFBody->GetIsGlobalFunc() && !pFBody->IsEval();
            bool dontAddGlobalsDirectly = (frameWalkerFlags & FrameWalkerFlags::FW_DontAddGlobalsDirectly) == FrameWalkerFlags::FW_DontAddGlobalsDirectly;
            if (shouldAddGlobalItemsDirectly && !dontAddGlobalsDirectly)
            {
                // Global properties will be enumerated using RootObjectVariablesWalker
                pVarWalkers->Add(Anew(arena, RootObjectVariablesWalker, pFrame, pFrame->GetRootObject(), UIGroupType_None));
            }

            DebuggerScope *formalScope = GetScopeWhenHaltAtFormals(pFrame);
            DWORD localsType = GetCurrentFramesLocalsType(pFrame);

            // If we are in the formal scope of a split scoped function then we can skip checking the body scope
            if (!VariableWalkerBase::IsInParamScope(formalScope, pFrame) || pFBody->IsParamAndBodyScopeMerged())
            {
                VariableWalkerBase *pVarWalker = nullptr;

                // More than one localsType can occur in the scope
                if (localsType & FramesLocalType::LocalType_InObject)
                {
                    Assert(scopeCount > 0);
                    pVarWalker = Anew(arena, ObjectVariablesWalker, pFrame, pDisplay->GetItem(nextStartIndex), UIGroupType_None, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference));
                    nextStartIndex++;
                }
                else if (localsType & FramesLocalType::LocalType_InSlot)
                {
                    Assert(scopeCount > 0);
                    pVarWalker = Anew(arena, SlotArrayVariablesWalker, pFrame, (Js::Var *)pDisplay->GetItem(nextStartIndex), UIGroupType_None, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference));
                    nextStartIndex++;
                }
                else if (scopeCount > 0 && pFBody->GetFrameDisplayRegister() != 0 && pFBody->IsParamAndBodyScopeMerged())
                {
                    Assert((Var)pDisplay->GetItem(0) == pFrame->GetScriptContext()->GetLibrary()->GetNull());
                    nextStartIndex++;
                }

                if (pVarWalker)
                {
                    pVarWalkers->Add(pVarWalker);
                }
            }

            // If we are halted at formal place, and param and body scopes are splitted we need to make use of formal debugger scope to to determine the locals type.
            if (formalScope != nullptr && !pFBody->IsParamAndBodyScopeMerged())
            {
                if (pFBody->GetPropertyIdOnRegSlotsContainer() && pFBody->GetPropertyIdOnRegSlotsContainer()->formalsUpperBound != Js::Constants::NoRegister)
                {
                    localsType |= FramesLocalType::LocalType_Reg;
                }

                Assert(scopeCount > 0);
                if (formalScope->scopeType == Js::DiagParamScopeInObject)
                {
                    // Need to add the param scope frame display as a separate walker as the ObjectVariablesWalker directly uses the socpe object to retrieve properties
                    pVarWalkers->Add(Anew(arena, ObjectVariablesWalker, pFrame, pDisplay->GetItem(nextStartIndex), UIGroupType_Param, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                }
                else
                {
                    pVarWalkers->Add(Anew(arena, SlotArrayVariablesWalker, pFrame, (Js::Var *)pDisplay->GetItem(nextStartIndex), UIGroupType_Param, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                }
                nextStartIndex++;
            }

            if (localsType & FramesLocalType::LocalType_Reg)
            {
                pVarWalkers->Add(Anew(arena, RegSlotVariablesWalker, pFrame, nullptr /*not debugger scope*/, UIGroupType_None, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
            }

            const Js::Var nullVar = pFrame->GetScriptContext()->GetLibrary()->GetNull();
            for (uint i = nextStartIndex; i < (uint)scopeCount; i++)
            {
                Var currentScopeObject = pDisplay->GetItem(i);
                if (currentScopeObject != nullptr && currentScopeObject != nullVar) // Skip nullptr (dummy scope)
                {
                    ScopeType scopeType = FrameDisplay::GetScopeType(currentScopeObject);
                    switch(scopeType)
                    {
                    case ScopeType_ActivationObject:
                        pVarWalkers->Add(Anew(arena, ObjectVariablesWalker, pFrame, currentScopeObject, UIGroupType_Scope, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                        break;
                    case ScopeType_SlotArray:
                        pVarWalkers->Add(Anew(arena, SlotArrayVariablesWalker, pFrame, currentScopeObject, UIGroupType_Scope, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                        break;
                    case ScopeType_WithScope:
                        if( (frameWalkerFlags & FrameWalkerFlags::FW_EnumWithScopeAlso) == FrameWalkerFlags::FW_EnumWithScopeAlso)
                        {
                            RecyclableObjectWalker* withScopeWalker = Anew(arena, RecyclableObjectWalker, pFrame->GetScriptContext(), currentScopeObject);
                            pVarWalkers->Add(Anew(arena, DiagScopeVariablesWalker, pFrame, currentScopeObject, withScopeWalker));
                        }
                        break;
                    default:
                        Assert(false);
                    }
                }
            }

            // No need to add global properties if this is a global function, as it is already done above.
            if (!shouldAddGlobalItemsDirectly && !dontAddGlobalsDirectly)
            {
                pVarWalkers->Add(Anew(arena, RootObjectVariablesWalker, pFrame, pFrame->GetRootObject(),  UIGroupType_Globals));
            }
        }
    }